

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void google::protobuf::compiler::CodeGeneratorResponse::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  CodeGeneratorResponse *this;
  MessageLite *value;
  CodeGeneratorResponse **v1;
  CodeGeneratorResponse **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *this_00;
  RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File> *other;
  uint32_t *puVar3;
  Arena *arena;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  CodeGeneratorResponse *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  CodeGeneratorResponse *from;
  CodeGeneratorResponse *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  CodeGeneratorResponse *local_18;
  anon_union_56_1_493b367e_for_CodeGeneratorResponse_10 *local_10;
  
  local_50 = (CodeGeneratorResponse *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (CodeGeneratorResponse *)to_msg;
  _this = (CodeGeneratorResponse *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::compiler::CodeGeneratorResponse_const*>(&local_50);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::compiler::CodeGeneratorResponse*>(&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::compiler::CodeGeneratorResponse_const*,google::protobuf::compiler::CodeGeneratorResponse*>
                       (v1,v2,"&from != _this");
  if (local_48 == (Nullable<const_char_*>)0x0) {
    this_00 = _internal_mutable_file(from);
    other = _internal_file((CodeGeneratorResponse *)absl_log_internal_check_op_result);
    RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::MergeFrom
              (this_00,other);
    puVar3 = protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    this = from;
    uVar1 = *puVar3;
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 1) != 0) {
        to_msg_local = (MessageLite *)
                       _internal_error_abi_cxx11_
                                 ((CodeGeneratorResponse *)absl_log_internal_check_op_result);
        local_18 = this;
        local_10 = &this->field_0;
        puVar3 = protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
        value = to_msg_local;
        *puVar3 = *puVar3 | 1;
        arena = protobuf::MessageLite::GetArena((MessageLite *)this);
        protobuf::internal::ArenaStringPtr::Set<>
                  (&(this->field_0)._impl_.error_,(string *)value,arena);
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.supported_features_ =
             *(uint64_t *)(absl_log_internal_check_op_result + 0x38);
      }
      if ((uVar1 & 4) != 0) {
        (from->field_0)._impl_.minimum_edition_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0x40);
      }
      if ((uVar1 & 8) != 0) {
        (from->field_0)._impl_.maximum_edition_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0x44);
      }
    }
    puVar3 = protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
    protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
             ,0x6e1,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

void CodeGeneratorResponse::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<CodeGeneratorResponse*>(&to_msg);
  auto& from = static_cast<const CodeGeneratorResponse&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_file()->MergeFrom(
      from._internal_file());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_error(from._internal_error());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.supported_features_ = from._impl_.supported_features_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.minimum_edition_ = from._impl_.minimum_edition_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.maximum_edition_ = from._impl_.maximum_edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}